

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void printPt(ostream *out,ANNpoint p,int dim)

{
  ostream *poVar1;
  int in_EDX;
  double *in_RSI;
  ostream *in_RDI;
  int i;
  int local_18;
  
  poVar1 = std::operator<<(in_RDI,"(");
  std::ostream::operator<<(poVar1,*in_RSI);
  for (local_18 = 1; local_18 < in_EDX; local_18 = local_18 + 1) {
    poVar1 = std::operator<<(in_RDI,", ");
    std::ostream::operator<<(poVar1,in_RSI[local_18]);
  }
  std::operator<<(in_RDI,")\n");
  return;
}

Assistant:

void printPt(ostream &out, ANNpoint p, int dim)  // print point
{
    out << "(" << p[0];
    for (int i = 1; i < dim; i++) {
        out << ", " << p[i];
    }
    out << ")\n";
}